

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclWorker.cpp
# Opt level: O0

void __thiscall xmrig::OclWorker::OclWorker(OclWorker *this,size_t id,OclLaunchData *data)

{
  uint32_t __c;
  undefined4 uVar1;
  char *pcVar2;
  OclSharedData *pOVar3;
  void *pvVar4;
  long in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  exception *ex;
  OclLaunchData *in_stack_00000270;
  size_t in_stack_00000278;
  OclCnRunner *in_stack_00000280;
  undefined8 in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  undefined8 *puVar5;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  Worker::Worker((Worker *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  *in_RDI = &PTR__OclWorker_002b8130;
  in_RDI[7] = *(undefined8 *)(in_RDX + 0x18);
  __c = OclThread::intensity((OclThread *)(in_RDX + 0x98));
  *(uint32_t *)(in_RDI + 8) = __c;
  in_RDI[9] = 0;
  puVar5 = in_RDI + 10;
  pcVar2 = OclDevice::index((OclDevice *)(in_RDX + 0x20),in_RSI,__c);
  uVar1 = SUB84(pcVar2,0);
  pOVar3 = OclSharedState::get(0);
  *puVar5 = pOVar3;
  WorkerJob<1UL>::WorkerJob((WorkerJob<1UL> *)CONCAT44(uVar1,in_stack_ffffffffffffffb0));
  pvVar4 = operator_new(0x110);
  OclCnRunner::OclCnRunner(in_stack_00000280,in_stack_00000278,in_stack_00000270);
  in_RDI[9] = pvVar4;
  if (in_RDI[9] != 0) {
    (**(code **)(*(long *)in_RDI[9] + 0x58))();
    (**(code **)(*(long *)in_RDI[9] + 0x50))();
  }
  return;
}

Assistant:

xmrig::OclWorker::OclWorker(size_t id, const OclLaunchData &data) :
    Worker(id, data.affinity, -1),
    m_miner(data.miner),
    m_intensity(data.thread.intensity()),
    m_sharedData(OclSharedState::get(data.device.index()))
{

    m_runner = new OclCnRunner(id, data);
        if (!m_runner) {
            return;
    }

    try {
        m_runner->init();
        m_runner->build();
    }
    catch (std::exception &ex) {
        printError(id, ex.what());

        delete m_runner;
        m_runner = nullptr;
    }
}